

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O3

void y4m_convert_42xpaldv_42xjpeg(y4m_input *_y4m,uchar *_dst,uchar *_aux)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int _c_h;
  uint uVar8;
  byte *pbVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  uint _c_w;
  long lVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  byte *_dst_00;
  ulong uVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  uchar *puVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  uchar *local_c0;
  
  iVar1 = _y4m->pic_w;
  _c_w = (iVar1 - (iVar1 + 1 >> 0x1f)) + 1 >> 1;
  uVar2 = (long)(_y4m->pic_h + _y4m->dst_c_dec_h + -1) / (long)_y4m->dst_c_dec_h;
  _c_h = (int)uVar2;
  iVar17 = _c_h * _c_w;
  uVar28 = 2;
  if (_c_h < 2) {
    uVar28 = uVar2 & 0xffffffff;
  }
  iVar26 = _c_h + -1;
  uVar14 = 3;
  if (_c_h < 3) {
    uVar14 = uVar2 & 0xffffffff;
  }
  lVar24 = (long)(int)_c_w;
  uVar12 = 1;
  if (1 < (int)_c_w) {
    uVar12 = _c_w;
  }
  uVar10 = _c_h - 3;
  uVar8 = _c_h - 2;
  iVar11 = 1;
  _dst_00 = _aux + iVar17 * 2;
  local_c0 = _dst + _y4m->pic_h * iVar1;
  do {
    y4m_42xmpeg2_42xjpeg_helper(_dst_00,_aux,_c_w,_c_h);
    if (iVar11 == 1) {
      pbVar9 = _dst_00;
      puVar25 = local_c0;
      if (0 < iVar1) {
        lVar16 = 0;
        do {
          if (_c_h < 1) {
            uVar20 = 0;
          }
          else {
            lVar18 = 0;
            uVar21 = 0;
            do {
              iVar27 = (int)uVar21;
              iVar13 = 1;
              if (1 < iVar27) {
                iVar13 = iVar27;
              }
              uVar21 = uVar21 + 1;
              iVar23 = iVar26;
              if ((int)uVar21 < iVar26) {
                iVar23 = (int)uVar21;
              }
              iVar3 = iVar27 + 2;
              if (iVar26 <= iVar27 + 2) {
                iVar3 = iVar26;
              }
              iVar13 = (int)((uint)pbVar9[(int)((iVar13 + -1) * _c_w)] * 0x23 + (uint)*pbVar9 * -8 +
                             (uint)pbVar9[lVar18] * 0x72 +
                             (uint)pbVar9[(int)(iVar23 * _c_w)] * -0x11 +
                             (uint)pbVar9[(int)(iVar3 * _c_w)] * 4 + 0x40) >> 7;
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              if (iVar13 < 1) {
                iVar13 = 0;
              }
              puVar25[lVar18] = (uchar)iVar13;
              lVar18 = lVar18 + (ulong)_c_w;
              uVar20 = uVar14;
            } while (uVar14 != uVar21);
          }
          uVar21 = uVar20;
          if ((int)uVar20 < (int)uVar8) {
            lVar15 = (uVar20 - 3) * lVar24;
            lVar22 = uVar8 - uVar20;
            lVar18 = lVar16;
            do {
              lVar4 = lVar18 + lVar15;
              lVar5 = lVar24 + lVar4;
              lVar6 = lVar24 + lVar5;
              lVar7 = lVar24 + lVar6;
              iVar13 = (int)((((uint)_dst_00[lVar24 + lVar6] * 0x72 +
                              (uint)_dst_00[lVar24 + lVar5] * 0x23 +
                              ((uint)_dst_00[lVar18 + lVar15] -
                              ((uint)_dst_00[lVar24 + lVar4] + (uint)_dst_00[lVar24 + lVar4] * 8)))
                             - ((uint)_dst_00[lVar24 + lVar7] * 0x10 + (uint)_dst_00[lVar24 + lVar7]
                               )) + (uint)_dst_00[lVar24 * 2 + lVar7] * 4 + 0x40) >> 7;
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              if (iVar13 < 1) {
                iVar13 = 0;
              }
              local_c0[lVar18 + lVar24 * uVar20] = (uchar)iVar13;
              lVar18 = lVar18 + lVar24;
              lVar22 = lVar22 + -1;
              uVar21 = (ulong)uVar8;
            } while (lVar22 != 0);
          }
          iVar13 = (int)uVar21;
          if (iVar13 < _c_h) {
            lVar15 = (uVar2 & 0xffffffff) - uVar21;
            lVar18 = lVar16;
            do {
              iVar13 = iVar13 + 1;
              iVar27 = iVar26;
              if (iVar13 < iVar26) {
                iVar27 = iVar13;
              }
              iVar27 = (int)(((((uint)_dst_00[lVar18 + (uVar21 - 3) * lVar24] -
                               ((uint)_dst_00[lVar18 + (uVar21 - 2) * lVar24] +
                               (uint)_dst_00[lVar18 + (uVar21 - 2) * lVar24] * 8)) +
                               (uint)_dst_00[lVar18 + (uVar21 - 1) * lVar24] * 0x23 +
                              (uint)_dst_00[lVar18 + lVar24 * uVar21] * 0x72) -
                             ((uint)pbVar9[(int)(iVar27 * _c_w)] * 0x10 +
                             (uint)pbVar9[(int)(iVar27 * _c_w)])) +
                             (uint)pbVar9[(int)(iVar26 * _c_w)] * 4 + 0x40) >> 7;
              if (0xfe < iVar27) {
                iVar27 = 0xff;
              }
              if (iVar27 < 1) {
                iVar27 = 0;
              }
              local_c0[lVar18 + lVar24 * uVar21] = (uchar)iVar27;
              lVar18 = lVar18 + lVar24;
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
          }
          puVar25 = puVar25 + 1;
          pbVar9 = pbVar9 + 1;
          lVar16 = lVar16 + 1;
        } while ((uint)lVar16 != uVar12);
      }
      pbVar9 = pbVar9 + (int)-_c_w;
      puVar25 = puVar25 + (int)(iVar17 - _c_w);
    }
    else {
      pbVar9 = _dst_00;
      puVar25 = local_c0;
      if (0 < iVar1) {
        lVar16 = 0;
        do {
          if (_c_h < 1) {
            uVar20 = 0;
          }
          else {
            lVar18 = 0;
            uVar21 = 0;
            do {
              uVar19 = uVar21 + 1;
              iVar13 = iVar26;
              if ((int)uVar19 < iVar26) {
                iVar13 = (int)uVar19;
              }
              iVar27 = (int)uVar21 + 2;
              if (iVar26 <= iVar27) {
                iVar27 = iVar26;
              }
              iVar23 = (int)uVar21 + 3;
              if (iVar26 <= iVar23) {
                iVar23 = iVar26;
              }
              iVar13 = (int)((((uint)pbVar9[lVar18] * 0x72 + (uint)*pbVar9 * -0xd +
                              (uint)pbVar9[(int)(iVar13 * _c_w)] * 0x23) -
                             ((uint)pbVar9[(int)(iVar27 * _c_w)] +
                             (uint)pbVar9[(int)(iVar27 * _c_w)] * 8)) +
                             (uint)pbVar9[(int)(iVar23 * _c_w)] + 0x40) >> 7;
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              if (iVar13 < 1) {
                iVar13 = 0;
              }
              puVar25[lVar18] = (uchar)iVar13;
              lVar18 = lVar18 + (ulong)_c_w;
              uVar20 = uVar28;
              uVar21 = uVar19;
            } while (uVar28 != uVar19);
          }
          uVar21 = uVar20;
          if ((int)uVar20 < (int)uVar10) {
            lVar15 = (uVar20 - 2) * lVar24;
            lVar22 = uVar10 - uVar20;
            lVar18 = lVar16;
            do {
              lVar4 = lVar18 + lVar15;
              lVar5 = lVar24 + lVar4;
              lVar6 = lVar24 + lVar5;
              lVar7 = lVar24 + lVar6;
              iVar13 = (int)((uint)_dst_00[lVar24 * 2 + lVar7] +
                             (((uint)_dst_00[lVar24 + lVar6] * 0x23 +
                              (uint)_dst_00[lVar24 + lVar5] * 0x72 +
                              (uint)_dst_00[lVar18 + lVar15] * 4 +
                              (uint)_dst_00[lVar24 + lVar4] * -0x11) -
                             ((uint)_dst_00[lVar24 + lVar7] + (uint)_dst_00[lVar24 + lVar7] * 8)) +
                            0x40) >> 7;
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              if (iVar13 < 1) {
                iVar13 = 0;
              }
              local_c0[lVar18 + lVar24 * uVar20] = (uchar)iVar13;
              lVar18 = lVar18 + lVar24;
              lVar22 = lVar22 + -1;
              uVar21 = (ulong)uVar10;
            } while (lVar22 != 0);
          }
          if ((int)uVar21 < _c_h) {
            iVar13 = (int)uVar21 + 2;
            lVar15 = (uVar2 & 0xffffffff) - uVar21;
            lVar18 = lVar16;
            do {
              iVar27 = iVar13 + -1;
              if (iVar26 <= iVar13 + -1) {
                iVar27 = iVar26;
              }
              iVar23 = iVar26;
              if (iVar13 < iVar26) {
                iVar23 = iVar13;
              }
              iVar27 = (int)((((uint)_dst_00[lVar18 + (uVar21 - 2) * lVar24] * 4 +
                               (uint)_dst_00[lVar18 + (uVar21 - 1) * lVar24] * -0x11 +
                               (uint)_dst_00[lVar18 + lVar24 * uVar21] * 0x72 +
                              (uint)pbVar9[(int)(iVar27 * _c_w)] * 0x23) -
                             ((uint)pbVar9[(int)(iVar23 * _c_w)] +
                             (uint)pbVar9[(int)(iVar23 * _c_w)] * 8)) +
                             (uint)pbVar9[(int)(iVar26 * _c_w)] + 0x40) >> 7;
              if (0xfe < iVar27) {
                iVar27 = 0xff;
              }
              if (iVar27 < 1) {
                iVar27 = 0;
              }
              local_c0[lVar18 + lVar24 * uVar21] = (uchar)iVar27;
              iVar13 = iVar13 + 1;
              lVar18 = lVar18 + lVar24;
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
          }
          puVar25 = puVar25 + 1;
          pbVar9 = pbVar9 + 1;
          lVar16 = lVar16 + 1;
        } while ((uint)lVar16 != uVar12);
      }
    }
    _aux = _aux + iVar17;
    iVar11 = iVar11 + 1;
    _dst_00 = pbVar9;
    local_c0 = puVar25;
  } while (iVar11 != 3);
  return;
}

Assistant:

static void y4m_convert_42xpaldv_42xjpeg(y4m_input *_y4m, unsigned char *_dst,
                                         unsigned char *_aux) {
  unsigned char *tmp;
  int c_w;
  int c_h;
  int c_sz;
  int pli;
  int y;
  int x;
  /*Skip past the luma data.*/
  _dst += _y4m->pic_w * _y4m->pic_h;
  /*Compute the size of each chroma plane.*/
  c_w = (_y4m->pic_w + 1) / 2;
  c_h = (_y4m->pic_h + _y4m->dst_c_dec_h - 1) / _y4m->dst_c_dec_h;
  c_sz = c_w * c_h;
  tmp = _aux + 2 * c_sz;
  for (pli = 1; pli < 3; pli++) {
    /*First do the horizontal re-sampling.
      This is the same as the mpeg2 case, except that after the horizontal
       case, we need to apply a second vertical filter.*/
    y4m_42xmpeg2_42xjpeg_helper(tmp, _aux, c_w, c_h);
    _aux += c_sz;
    switch (pli) {
      case 1: {
        /*Slide C_b up a quarter-pel.
          This is the same filter used above, but in the other order.*/
        for (x = 0; x < c_w; x++) {
          for (y = 0; y < OC_MINI(c_h, 3); y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (tmp[0] - 9 * tmp[OC_MAXI(y - 2, 0) * c_w] +
                 35 * tmp[OC_MAXI(y - 1, 0) * c_w] + 114 * tmp[y * c_w] -
                 17 * tmp[OC_MINI(y + 1, c_h - 1) * c_w] +
                 4 * tmp[OC_MINI(y + 2, c_h - 1) * c_w] + 64) >>
                    7,
                255);
          }
          for (; y < c_h - 2; y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (tmp[(y - 3) * c_w] - 9 * tmp[(y - 2) * c_w] +
                 35 * tmp[(y - 1) * c_w] + 114 * tmp[y * c_w] -
                 17 * tmp[(y + 1) * c_w] + 4 * tmp[(y + 2) * c_w] + 64) >>
                    7,
                255);
          }
          for (; y < c_h; y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (tmp[(y - 3) * c_w] - 9 * tmp[(y - 2) * c_w] +
                 35 * tmp[(y - 1) * c_w] + 114 * tmp[y * c_w] -
                 17 * tmp[OC_MINI(y + 1, c_h - 1) * c_w] +
                 4 * tmp[(c_h - 1) * c_w] + 64) >>
                    7,
                255);
          }
          _dst++;
          tmp++;
        }
        _dst += c_sz - c_w;
        tmp -= c_w;
      } break;
      case 2: {
        /*Slide C_r down a quarter-pel.
          This is the same as the horizontal filter.*/
        for (x = 0; x < c_w; x++) {
          for (y = 0; y < OC_MINI(c_h, 2); y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (4 * tmp[0] - 17 * tmp[OC_MAXI(y - 1, 0) * c_w] +
                 114 * tmp[y * c_w] + 35 * tmp[OC_MINI(y + 1, c_h - 1) * c_w] -
                 9 * tmp[OC_MINI(y + 2, c_h - 1) * c_w] +
                 tmp[OC_MINI(y + 3, c_h - 1) * c_w] + 64) >>
                    7,
                255);
          }
          for (; y < c_h - 3; y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (4 * tmp[(y - 2) * c_w] - 17 * tmp[(y - 1) * c_w] +
                 114 * tmp[y * c_w] + 35 * tmp[(y + 1) * c_w] -
                 9 * tmp[(y + 2) * c_w] + tmp[(y + 3) * c_w] + 64) >>
                    7,
                255);
          }
          for (; y < c_h; y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (4 * tmp[(y - 2) * c_w] - 17 * tmp[(y - 1) * c_w] +
                 114 * tmp[y * c_w] + 35 * tmp[OC_MINI(y + 1, c_h - 1) * c_w] -
                 9 * tmp[OC_MINI(y + 2, c_h - 1) * c_w] + tmp[(c_h - 1) * c_w] +
                 64) >>
                    7,
                255);
          }
          _dst++;
          tmp++;
        }
      } break;
    }
    /*For actual interlaced material, this would have to be done separately on
       each field, and the shift amounts would be different.
      C_r moves down 1/8, C_b up 3/8 in the top field, and C_r moves down 3/8,
       C_b up 1/8 in the bottom field.
      The corresponding filters would be:
       Down 1/8 (reverse order for up): [3 -11 125 15 -4 0]/128
       Down 3/8 (reverse order for up): [4 -19 98 56 -13 2]/128*/
  }
}